

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

ion_bpp_err_t b_open(ion_bpp_open_t info,ion_bpp_handle_t *handle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  undefined8 *puVar24;
  undefined1 auVar25 [16];
  ion_boolean_t iVar26;
  ion_err_t iVar27;
  ion_bpp_err_t iVar28;
  undefined8 *__ptr;
  void *pvVar29;
  void *pvVar30;
  ion_file_handle_t pFVar31;
  ion_file_offset_t iVar32;
  ulong uVar33;
  int iVar34;
  long lVar35;
  int iVar46;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  long lVar47;
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar69;
  undefined1 auVar67 [16];
  int iVar70;
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar88;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ion_bpp_buffer_t *local_38;
  long lVar50;
  
  iVar28 = bErrSectorSize;
  if (((undefined1  [32])info & (undefined1  [32])0x3) == (undefined1  [32])0x0 &&
      199 < info.sectorSize) {
    iVar23 = (int)info.sectorSize;
    iVar34 = (int)((ulong)(long)(iVar23 + -0x27) / ((long)info.keySize + 0x10U));
    if (5 < iVar34) {
      __ptr = (undefined8 *)calloc(1,200);
      if (__ptr == (undefined8 *)0x0) {
        iVar28 = bErrMemory;
        if (bErrLineNo == 0) {
          bErrLineNo = 0x3a0;
        }
      }
      else {
        *(int *)(__ptr + 1) = info.keySize;
        *(ion_bpp_bool_t *)((long)__ptr + 0xc) = info.dupKeys;
        *(int *)(__ptr + 2) = iVar23;
        __ptr[3] = info.comp;
        *(int *)((long)__ptr + 0xbc) = info.keySize + 0x10;
        *(int *)(__ptr + 0x17) = iVar34;
        pvVar29 = calloc(7,0x28);
        __ptr[0xe] = pvVar29;
        if (pvVar29 == (void *)0x0) {
          iVar28 = bErrMemory;
          if (bErrLineNo == 0) {
            bErrLineNo = 0x3b6;
          }
        }
        else {
          iVar34 = iVar23 * 0xd + (info.keySize + 0x10) * 2;
          pvVar30 = malloc((long)iVar34);
          __ptr[0xf] = pvVar30;
          auVar25 = _DAT_0010eaa0;
          if (pvVar30 == (void *)0x0) {
            iVar28 = bErrMemory;
            if (bErrLineNo == 0) {
              bErrLineNo = 0x3c4;
            }
          }
          else {
            if (0 < iVar34) {
              lVar35 = (long)iVar34 - 1;
              auVar36._8_4_ = (int)lVar35;
              auVar36._0_8_ = lVar35;
              auVar36._12_4_ = (int)((ulong)lVar35 >> 0x20);
              uVar33 = 0;
              auVar37 = auVar36;
              auVar49 = _DAT_0010ea20;
              auVar51 = _DAT_0010ea30;
              auVar52 = _DAT_0010ea40;
              auVar53 = _DAT_0010ea50;
              auVar54 = _DAT_0010ea60;
              auVar55 = _DAT_0010ea70;
              auVar56 = _DAT_0010ea80;
              auVar57 = _DAT_0010ea90;
              do {
                auVar67 = auVar36 ^ auVar25;
                auVar71 = auVar57 ^ auVar25;
                iVar46 = auVar67._0_4_;
                iVar84 = -(uint)(iVar46 < auVar71._0_4_);
                iVar48 = auVar67._4_4_;
                auVar73._4_4_ = -(uint)(iVar48 < auVar71._4_4_);
                iVar69 = auVar67._8_4_;
                iVar88 = -(uint)(iVar69 < auVar71._8_4_);
                iVar70 = auVar67._12_4_;
                auVar73._12_4_ = -(uint)(iVar70 < auVar71._12_4_);
                auVar67._4_4_ = iVar84;
                auVar67._0_4_ = iVar84;
                auVar67._8_4_ = iVar88;
                auVar67._12_4_ = iVar88;
                auVar67 = pshuflw(auVar37,auVar67,0xe8);
                auVar72._4_4_ = -(uint)(auVar71._4_4_ == iVar48);
                auVar72._12_4_ = -(uint)(auVar71._12_4_ == iVar70);
                auVar72._0_4_ = auVar72._4_4_;
                auVar72._8_4_ = auVar72._12_4_;
                auVar58 = pshuflw(in_XMM11,auVar72,0xe8);
                auVar73._0_4_ = auVar73._4_4_;
                auVar73._8_4_ = auVar73._12_4_;
                auVar71 = pshuflw(auVar67,auVar73,0xe8);
                auVar37._8_4_ = 0xffffffff;
                auVar37._0_8_ = 0xffffffffffffffff;
                auVar37._12_4_ = 0xffffffff;
                auVar37 = (auVar71 | auVar58 & auVar67) ^ auVar37;
                auVar37 = packssdw(auVar37,auVar37);
                if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined1 *)((long)pvVar30 + uVar33) = 0;
                }
                auVar58._4_4_ = iVar84;
                auVar58._0_4_ = iVar84;
                auVar58._8_4_ = iVar88;
                auVar58._12_4_ = iVar88;
                auVar73 = auVar72 & auVar58 | auVar73;
                auVar37 = packssdw(auVar73,auVar73);
                auVar71._8_4_ = 0xffffffff;
                auVar71._0_8_ = 0xffffffffffffffff;
                auVar71._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37 ^ auVar71,auVar37 ^ auVar71);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37._0_4_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 1) = 0;
                }
                auVar37 = auVar56 ^ auVar25;
                auVar59._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
                auVar59._4_4_ = -(uint)(iVar48 < auVar37._4_4_);
                auVar59._8_4_ = -(uint)(iVar69 < auVar37._8_4_);
                auVar59._12_4_ = -(uint)(iVar70 < auVar37._12_4_);
                auVar74._4_4_ = auVar59._0_4_;
                auVar74._0_4_ = auVar59._0_4_;
                auVar74._8_4_ = auVar59._8_4_;
                auVar74._12_4_ = auVar59._8_4_;
                iVar84 = -(uint)(auVar37._4_4_ == iVar48);
                iVar88 = -(uint)(auVar37._12_4_ == iVar70);
                auVar10._4_4_ = iVar84;
                auVar10._0_4_ = iVar84;
                auVar10._8_4_ = iVar88;
                auVar10._12_4_ = iVar88;
                auVar85._4_4_ = auVar59._4_4_;
                auVar85._0_4_ = auVar59._4_4_;
                auVar85._8_4_ = auVar59._12_4_;
                auVar85._12_4_ = auVar59._12_4_;
                auVar37 = auVar10 & auVar74 | auVar85;
                auVar37 = packssdw(auVar37,auVar37);
                auVar1._8_4_ = 0xffffffff;
                auVar1._0_8_ = 0xffffffffffffffff;
                auVar1._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37 ^ auVar1,auVar37 ^ auVar1);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 2) = 0;
                }
                auVar37 = pshufhw(auVar37,auVar74,0x84);
                auVar11._4_4_ = iVar84;
                auVar11._0_4_ = iVar84;
                auVar11._8_4_ = iVar88;
                auVar11._12_4_ = iVar88;
                auVar71 = pshufhw(auVar59,auVar11,0x84);
                auVar67 = pshufhw(auVar37,auVar85,0x84);
                auVar38._8_4_ = 0xffffffff;
                auVar38._0_8_ = 0xffffffffffffffff;
                auVar38._12_4_ = 0xffffffff;
                auVar38 = (auVar67 | auVar71 & auVar37) ^ auVar38;
                auVar37 = packssdw(auVar38,auVar38);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37._0_4_ >> 0x18 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 3) = 0;
                }
                auVar37 = auVar55 ^ auVar25;
                auVar60._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
                auVar60._4_4_ = -(uint)(iVar48 < auVar37._4_4_);
                auVar60._8_4_ = -(uint)(iVar69 < auVar37._8_4_);
                auVar60._12_4_ = -(uint)(iVar70 < auVar37._12_4_);
                auVar12._4_4_ = auVar60._0_4_;
                auVar12._0_4_ = auVar60._0_4_;
                auVar12._8_4_ = auVar60._8_4_;
                auVar12._12_4_ = auVar60._8_4_;
                auVar71 = pshuflw(auVar85,auVar12,0xe8);
                auVar39._0_4_ = -(uint)(auVar37._0_4_ == iVar46);
                auVar39._4_4_ = -(uint)(auVar37._4_4_ == iVar48);
                auVar39._8_4_ = -(uint)(auVar37._8_4_ == iVar69);
                auVar39._12_4_ = -(uint)(auVar37._12_4_ == iVar70);
                auVar75._4_4_ = auVar39._4_4_;
                auVar75._0_4_ = auVar39._4_4_;
                auVar75._8_4_ = auVar39._12_4_;
                auVar75._12_4_ = auVar39._12_4_;
                auVar37 = pshuflw(auVar39,auVar75,0xe8);
                auVar76._4_4_ = auVar60._4_4_;
                auVar76._0_4_ = auVar60._4_4_;
                auVar76._8_4_ = auVar60._12_4_;
                auVar76._12_4_ = auVar60._12_4_;
                auVar67 = pshuflw(auVar60,auVar76,0xe8);
                auVar2._8_4_ = 0xffffffff;
                auVar2._0_8_ = 0xffffffffffffffff;
                auVar2._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37 & auVar71,(auVar67 | auVar37 & auVar71) ^ auVar2);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 4) = 0;
                }
                auVar13._4_4_ = auVar60._0_4_;
                auVar13._0_4_ = auVar60._0_4_;
                auVar13._8_4_ = auVar60._8_4_;
                auVar13._12_4_ = auVar60._8_4_;
                auVar76 = auVar75 & auVar13 | auVar76;
                auVar67 = packssdw(auVar76,auVar76);
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37,auVar67 ^ auVar3);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37._4_2_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 5) = 0;
                }
                auVar37 = auVar54 ^ auVar25;
                auVar61._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
                auVar61._4_4_ = -(uint)(iVar48 < auVar37._4_4_);
                auVar61._8_4_ = -(uint)(iVar69 < auVar37._8_4_);
                auVar61._12_4_ = -(uint)(iVar70 < auVar37._12_4_);
                auVar77._4_4_ = auVar61._0_4_;
                auVar77._0_4_ = auVar61._0_4_;
                auVar77._8_4_ = auVar61._8_4_;
                auVar77._12_4_ = auVar61._8_4_;
                iVar84 = -(uint)(auVar37._4_4_ == iVar48);
                iVar88 = -(uint)(auVar37._12_4_ == iVar70);
                auVar14._4_4_ = iVar84;
                auVar14._0_4_ = iVar84;
                auVar14._8_4_ = iVar88;
                auVar14._12_4_ = iVar88;
                auVar86._4_4_ = auVar61._4_4_;
                auVar86._0_4_ = auVar61._4_4_;
                auVar86._8_4_ = auVar61._12_4_;
                auVar86._12_4_ = auVar61._12_4_;
                auVar37 = auVar14 & auVar77 | auVar86;
                auVar37 = packssdw(auVar37,auVar37);
                auVar4._8_4_ = 0xffffffff;
                auVar4._0_8_ = 0xffffffffffffffff;
                auVar4._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37 ^ auVar4,auVar37 ^ auVar4);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 6) = 0;
                }
                auVar37 = pshufhw(auVar37,auVar77,0x84);
                auVar15._4_4_ = iVar84;
                auVar15._0_4_ = iVar84;
                auVar15._8_4_ = iVar88;
                auVar15._12_4_ = iVar88;
                auVar71 = pshufhw(auVar61,auVar15,0x84);
                auVar67 = pshufhw(auVar37,auVar86,0x84);
                auVar40._8_4_ = 0xffffffff;
                auVar40._0_8_ = 0xffffffffffffffff;
                auVar40._12_4_ = 0xffffffff;
                auVar40 = (auVar67 | auVar71 & auVar37) ^ auVar40;
                auVar37 = packssdw(auVar40,auVar40);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37._6_2_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 7) = 0;
                }
                auVar37 = auVar53 ^ auVar25;
                auVar62._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
                auVar62._4_4_ = -(uint)(iVar48 < auVar37._4_4_);
                auVar62._8_4_ = -(uint)(iVar69 < auVar37._8_4_);
                auVar62._12_4_ = -(uint)(iVar70 < auVar37._12_4_);
                auVar16._4_4_ = auVar62._0_4_;
                auVar16._0_4_ = auVar62._0_4_;
                auVar16._8_4_ = auVar62._8_4_;
                auVar16._12_4_ = auVar62._8_4_;
                auVar71 = pshuflw(auVar86,auVar16,0xe8);
                auVar41._0_4_ = -(uint)(auVar37._0_4_ == iVar46);
                auVar41._4_4_ = -(uint)(auVar37._4_4_ == iVar48);
                auVar41._8_4_ = -(uint)(auVar37._8_4_ == iVar69);
                auVar41._12_4_ = -(uint)(auVar37._12_4_ == iVar70);
                auVar78._4_4_ = auVar41._4_4_;
                auVar78._0_4_ = auVar41._4_4_;
                auVar78._8_4_ = auVar41._12_4_;
                auVar78._12_4_ = auVar41._12_4_;
                auVar37 = pshuflw(auVar41,auVar78,0xe8);
                auVar79._4_4_ = auVar62._4_4_;
                auVar79._0_4_ = auVar62._4_4_;
                auVar79._8_4_ = auVar62._12_4_;
                auVar79._12_4_ = auVar62._12_4_;
                auVar67 = pshuflw(auVar62,auVar79,0xe8);
                auVar63._8_4_ = 0xffffffff;
                auVar63._0_8_ = 0xffffffffffffffff;
                auVar63._12_4_ = 0xffffffff;
                auVar63 = (auVar67 | auVar37 & auVar71) ^ auVar63;
                auVar67 = packssdw(auVar63,auVar63);
                auVar37 = packsswb(auVar37 & auVar71,auVar67);
                if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 8) = 0;
                }
                auVar17._4_4_ = auVar62._0_4_;
                auVar17._0_4_ = auVar62._0_4_;
                auVar17._8_4_ = auVar62._8_4_;
                auVar17._12_4_ = auVar62._8_4_;
                auVar79 = auVar78 & auVar17 | auVar79;
                auVar67 = packssdw(auVar79,auVar79);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                auVar67 = packssdw(auVar67 ^ auVar5,auVar67 ^ auVar5);
                auVar37 = packsswb(auVar37,auVar67);
                if ((auVar37._8_2_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 9) = 0;
                }
                auVar37 = auVar52 ^ auVar25;
                auVar64._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
                auVar64._4_4_ = -(uint)(iVar48 < auVar37._4_4_);
                auVar64._8_4_ = -(uint)(iVar69 < auVar37._8_4_);
                auVar64._12_4_ = -(uint)(iVar70 < auVar37._12_4_);
                auVar80._4_4_ = auVar64._0_4_;
                auVar80._0_4_ = auVar64._0_4_;
                auVar80._8_4_ = auVar64._8_4_;
                auVar80._12_4_ = auVar64._8_4_;
                iVar84 = -(uint)(auVar37._4_4_ == iVar48);
                iVar88 = -(uint)(auVar37._12_4_ == iVar70);
                auVar18._4_4_ = iVar84;
                auVar18._0_4_ = iVar84;
                auVar18._8_4_ = iVar88;
                auVar18._12_4_ = iVar88;
                auVar87._4_4_ = auVar64._4_4_;
                auVar87._0_4_ = auVar64._4_4_;
                auVar87._8_4_ = auVar64._12_4_;
                auVar87._12_4_ = auVar64._12_4_;
                auVar37 = auVar18 & auVar80 | auVar87;
                auVar37 = packssdw(auVar37,auVar37);
                auVar6._8_4_ = 0xffffffff;
                auVar6._0_8_ = 0xffffffffffffffff;
                auVar6._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37 ^ auVar6,auVar37 ^ auVar6);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 10) = 0;
                }
                auVar37 = pshufhw(auVar37,auVar80,0x84);
                auVar19._4_4_ = iVar84;
                auVar19._0_4_ = iVar84;
                auVar19._8_4_ = iVar88;
                auVar19._12_4_ = iVar88;
                auVar71 = pshufhw(auVar64,auVar19,0x84);
                auVar67 = pshufhw(auVar37,auVar87,0x84);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar42 = (auVar67 | auVar71 & auVar37) ^ auVar42;
                auVar37 = packssdw(auVar42,auVar42);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37._10_2_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 0xb) = 0;
                }
                auVar37 = auVar51 ^ auVar25;
                auVar65._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
                auVar65._4_4_ = -(uint)(iVar48 < auVar37._4_4_);
                auVar65._8_4_ = -(uint)(iVar69 < auVar37._8_4_);
                auVar65._12_4_ = -(uint)(iVar70 < auVar37._12_4_);
                auVar20._4_4_ = auVar65._0_4_;
                auVar20._0_4_ = auVar65._0_4_;
                auVar20._8_4_ = auVar65._8_4_;
                auVar20._12_4_ = auVar65._8_4_;
                auVar71 = pshuflw(auVar87,auVar20,0xe8);
                auVar43._0_4_ = -(uint)(auVar37._0_4_ == iVar46);
                auVar43._4_4_ = -(uint)(auVar37._4_4_ == iVar48);
                auVar43._8_4_ = -(uint)(auVar37._8_4_ == iVar69);
                auVar43._12_4_ = -(uint)(auVar37._12_4_ == iVar70);
                auVar81._4_4_ = auVar43._4_4_;
                auVar81._0_4_ = auVar43._4_4_;
                auVar81._8_4_ = auVar43._12_4_;
                auVar81._12_4_ = auVar43._12_4_;
                auVar37 = pshuflw(auVar43,auVar81,0xe8);
                auVar82._4_4_ = auVar65._4_4_;
                auVar82._0_4_ = auVar65._4_4_;
                auVar82._8_4_ = auVar65._12_4_;
                auVar82._12_4_ = auVar65._12_4_;
                auVar67 = pshuflw(auVar65,auVar82,0xe8);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37 & auVar71,(auVar67 | auVar37 & auVar71) ^ auVar7);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 0xc) = 0;
                }
                auVar21._4_4_ = auVar65._0_4_;
                auVar21._0_4_ = auVar65._0_4_;
                auVar21._8_4_ = auVar65._8_4_;
                auVar21._12_4_ = auVar65._8_4_;
                auVar82 = auVar81 & auVar21 | auVar82;
                auVar67 = packssdw(auVar82,auVar82);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37,auVar67 ^ auVar8);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37._12_2_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 0xd) = 0;
                }
                auVar37 = auVar49 ^ auVar25;
                auVar66._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
                auVar66._4_4_ = -(uint)(iVar48 < auVar37._4_4_);
                auVar66._8_4_ = -(uint)(iVar69 < auVar37._8_4_);
                auVar66._12_4_ = -(uint)(iVar70 < auVar37._12_4_);
                auVar83._4_4_ = auVar66._0_4_;
                auVar83._0_4_ = auVar66._0_4_;
                auVar83._8_4_ = auVar66._8_4_;
                auVar83._12_4_ = auVar66._8_4_;
                iVar46 = -(uint)(auVar37._4_4_ == iVar48);
                iVar48 = -(uint)(auVar37._12_4_ == iVar70);
                auVar68._4_4_ = iVar46;
                auVar68._0_4_ = iVar46;
                auVar68._8_4_ = iVar48;
                auVar68._12_4_ = iVar48;
                auVar44._4_4_ = auVar66._4_4_;
                auVar44._0_4_ = auVar66._4_4_;
                auVar44._8_4_ = auVar66._12_4_;
                auVar44._12_4_ = auVar66._12_4_;
                auVar44 = auVar68 & auVar83 | auVar44;
                auVar37 = packssdw(auVar44,auVar44);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar37 = packssdw(auVar37 ^ auVar9,auVar37 ^ auVar9);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 0xe) = 0;
                }
                auVar37 = pshufhw(auVar37,auVar83,0x84);
                in_XMM11 = pshufhw(auVar66,auVar68,0x84);
                in_XMM11 = in_XMM11 & auVar37;
                auVar22._4_4_ = auVar66._4_4_;
                auVar22._0_4_ = auVar66._4_4_;
                auVar22._8_4_ = auVar66._12_4_;
                auVar22._12_4_ = auVar66._12_4_;
                auVar37 = pshufhw(auVar37,auVar22,0x84);
                auVar45._8_4_ = 0xffffffff;
                auVar45._0_8_ = 0xffffffffffffffff;
                auVar45._12_4_ = 0xffffffff;
                auVar45 = (auVar37 | in_XMM11) ^ auVar45;
                auVar37 = packssdw(auVar45,auVar45);
                auVar37 = packsswb(auVar37,auVar37);
                if ((auVar37._14_2_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pvVar30 + uVar33 + 0xf) = 0;
                }
                uVar33 = uVar33 + 0x10;
                lVar35 = (long)DAT_0010eab0;
                lVar50 = auVar57._8_8_;
                auVar57._0_8_ = auVar57._0_8_ + lVar35;
                lVar47 = DAT_0010eab0._8_8_;
                auVar57._8_8_ = lVar50 + lVar47;
                lVar50 = auVar56._8_8_;
                auVar56._0_8_ = auVar56._0_8_ + lVar35;
                auVar56._8_8_ = lVar50 + lVar47;
                lVar50 = auVar55._8_8_;
                auVar55._0_8_ = auVar55._0_8_ + lVar35;
                auVar55._8_8_ = lVar50 + lVar47;
                lVar50 = auVar54._8_8_;
                auVar54._0_8_ = auVar54._0_8_ + lVar35;
                auVar54._8_8_ = lVar50 + lVar47;
                lVar50 = auVar53._8_8_;
                auVar53._0_8_ = auVar53._0_8_ + lVar35;
                auVar53._8_8_ = lVar50 + lVar47;
                lVar50 = auVar52._8_8_;
                auVar52._0_8_ = auVar52._0_8_ + lVar35;
                auVar52._8_8_ = lVar50 + lVar47;
                lVar50 = auVar51._8_8_;
                auVar51._0_8_ = auVar51._0_8_ + lVar35;
                auVar51._8_8_ = lVar50 + lVar47;
                lVar50 = auVar49._8_8_;
                auVar49._0_8_ = auVar49._0_8_ + lVar35;
                auVar49._8_8_ = lVar50 + lVar47;
                auVar37 = _DAT_0010eab0;
              } while ((iVar34 + 0xfU & 0xfffffff0) != uVar33);
            }
            __ptr[9] = pvVar29;
            __ptr[10] = (long)pvVar29 + 0xf0;
            iVar34 = 7;
            puVar24 = (undefined8 *)pvVar29;
            do {
              *puVar24 = puVar24 + 5;
              puVar24[1] = puVar24 + -5;
              puVar24[4] = 0;
              puVar24[3] = pvVar30;
              pvVar30 = (void *)((long)pvVar30 + (long)iVar23);
              iVar34 = iVar34 + -1;
              puVar24 = puVar24 + 5;
            } while (iVar34 != 0);
            *(undefined8 **)((long)pvVar29 + 8) = __ptr + 9;
            *(undefined8 **)((long)pvVar29 + 0xf0) = __ptr + 9;
            __ptr[7] = pvVar30;
            __ptr[0x13] = ((long)((info.sectorSize << 0x21) + (info.sectorSize << 0x20)) >> 0x20) +
                          (long)pvVar30;
            iVar26 = ion_fexists(info.iName);
            pFVar31 = ion_fopen(info.iName);
            *__ptr = pFVar31;
            if (iVar26 == '\0') {
              if (pFVar31 == (ion_file_handle_t)0x0) {
                free(__ptr);
                return bErrFileNotOpen;
              }
              memset((void *)__ptr[7],0,(long)*(int *)(__ptr + 2) * 3);
              *(ushort *)__ptr[7] = *(ushort *)__ptr[7] | 1;
              __ptr[0x18] = (long)*(int *)(__ptr + 2) * 3;
              *(undefined4 *)((long)__ptr + 0x44) = 1;
              flushAll(__ptr);
            }
            else {
              iVar28 = readDisk(__ptr,0,&local_38);
              if (iVar28 != bErrOk) {
                return iVar28;
              }
              iVar27 = ion_fseek((ion_file_handle_t)*__ptr,0,2);
              if (iVar27 != '\0') {
                if (bErrLineNo != 0) {
                  return bErrIO;
                }
                bErrLineNo = 0x3f1;
                return bErrIO;
              }
              iVar32 = ion_ftell((ion_file_handle_t)*__ptr);
              __ptr[0x18] = iVar32;
              if (iVar32 == -1) {
                if (bErrLineNo != 0) {
                  return bErrIO;
                }
                bErrLineNo = 0x3f5;
                return bErrIO;
              }
            }
            *handle = __ptr;
            iVar28 = bErrOk;
          }
        }
      }
    }
  }
  return iVar28;
}

Assistant:

ion_bpp_err_t
b_open(
	ion_bpp_open_t		info,
	ion_bpp_handle_t	*handle
) {
	ion_bpp_h_node_t	*h;
	ion_bpp_err_t		rc;			/* return code */
	int					bufCt;	/* number of tmp buffers */
	ion_bpp_buffer_t	*buf;				/* buffer */
	int					maxCt;	/* maximum number of keys in a node */
	ion_bpp_buffer_t	*root;
	int					i;
	ion_bpp_node_t		*p;

	if ((info.sectorSize < sizeof(ion_bpp_h_node_t)) || (0 != info.sectorSize % 4)) {
		return bErrSectorSize;
	}

	/* determine sizes and offsets */
	/* leaf/n, prev, next, [childLT,key,rec]... childGE */
	/* ensure that there are at least 3 children/parent for gather/scatter */
	maxCt	= info.sectorSize - (sizeof(ion_bpp_node_t) - sizeof(ion_bpp_key_t));
	maxCt	/= sizeof(ion_bpp_address_t) + info.keySize + sizeof(ion_bpp_external_address_t);

	if (maxCt < 6) {
		return bErrSectorSize;
	}

	/* copy parms to ion_bpp_h_node_t */
	if ((h = calloc(1, sizeof(ion_bpp_h_node_t))) == NULL) {
		return error(bErrMemory);
	}

	h->keySize		= info.keySize;
	h->dupKeys		= info.dupKeys;
	h->sectorSize	= info.sectorSize;
	h->comp			= info.comp;

	/* childLT, key, rec */
	h->ks			= sizeof(ion_bpp_address_t) + h->keySize + sizeof(ion_bpp_external_address_t);
	h->maxCt		= maxCt;

	/* Allocate buflist.
	 * During insert/delete, need simultaneous access to 7 buffers:
	 *  - 4 adjacent child bufs
	 *  - 1 parent buf
	 *  - 1 next sequential link
	 *  - 1 lastGE
	*/
	bufCt			= 7;

	if ((h->malloc1 = calloc(bufCt, sizeof(ion_bpp_buffer_t))) == NULL) {
		return error(bErrMemory);
	}

	buf = h->malloc1;

	/*
	 * Allocate bufs.
	 * We need space for the following:
	 *  - bufCt buffers, of size sectorSize
	 *  - 1 buffer for root, of size 3*sectorSize
	 *  - 1 buffer for gbuf, size 3*sectorsize + 2 extra keys
	 *	to allow for LT pointers in last 2 nodes when gathering 3 full nodes
	*/
	if ((h->malloc2 = malloc((bufCt + 6) * h->sectorSize + 2 * h->ks)) == NULL) {
		return error(bErrMemory);
	}

	for (i = 0; i < (bufCt + 6) * h->sectorSize + 2 * h->ks; i++) {
		((char *) h->malloc2)[i] = 0;
	}

	p				= h->malloc2;

	/* initialize buflist */
	h->bufList.next = buf;
	h->bufList.prev = buf + (bufCt - 1);

	for (i = 0; i < bufCt; i++) {
		buf->next		= buf + 1;
		buf->prev		= buf - 1;
		buf->modified	= boolean_false;
		buf->valid		= boolean_false;
		buf->p			= p;
		p				= (ion_bpp_node_t *) ((char *) p + h->sectorSize);
		buf++;
	}

	h->bufList.next->prev	= &h->bufList;
	h->bufList.prev->next	= &h->bufList;

	/* initialize root */
	root					= &h->root;
	root->p					= p;
	p						= (ion_bpp_node_t *) ((char *) p + 3 * h->sectorSize);
	h->gbuf.p				= p;/* done last to include extra 2 keys */

	h->curBuf				= NULL;
	h->curKey				= NULL;

	/* initialize root */
	if (ion_fexists(info.iName)) {
		/* open an existing database */
		h->fp = ion_fopen(info.iName);

		if ((rc = readDisk(h, 0, &root)) != 0) {
			return rc;
		}

		if (ion_fseek(h->fp, 0, ION_FILE_END)) {
			return error(bErrIO);
		}

		if ((h->nextFreeAdr = ion_ftell(h->fp)) == -1) {
			return error(bErrIO);
		}
	}

#if defined(ARDUINO)
	else if (NULL != (h->fp = ion_fopen(info.iName)).file) {
#else
	else if (NULL != (h->fp = ion_fopen(info.iName))) {
#endif
		/* initialize root */
		memset(root->p, 0, 3 * h->sectorSize);
		leaf(root)		= 1;
		h->nextFreeAdr	= 3 * h->sectorSize;
		root->modified	= 1;
		flushAll(h);
	}